

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O2

void __thiscall
jbcoin::STLedgerEntry::STLedgerEntry(STLedgerEntry *this,SerialIter *sit,uint256 *index)

{
  atomic<int> *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Counter *pCVar5;
  int depth;
  
  STObject::STObject(&this->super_STObject,(SField *)sfLedgerEntry);
  pCVar5 = CountedObject<jbcoin::STLedgerEntry>::getCounter();
  LOCK();
  paVar1 = &(pCVar5->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STLedgerEntry_002f81a0;
  uVar2 = *(undefined8 *)(index->pn + 2);
  uVar3 = *(undefined8 *)(index->pn + 4);
  uVar4 = *(undefined8 *)(index->pn + 6);
  *(undefined8 *)(this->key_).pn = *(undefined8 *)index->pn;
  *(undefined8 *)((this->key_).pn + 2) = uVar2;
  *(undefined8 *)((this->key_).pn + 4) = uVar3;
  *(undefined8 *)((this->key_).pn + 6) = uVar4;
  STObject::set(&this->super_STObject,sit,depth);
  setSLEType(this);
  return;
}

Assistant:

STLedgerEntry::STLedgerEntry (
        SerialIter& sit,
        uint256 const& index)
    : STObject (sfLedgerEntry)
    , key_ (index)
{
    set (sit);
    setSLEType ();
}